

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

common_sampler * common_sampler_init(llama_model *model,common_params_sampling *params)

{
  bool bVar1;
  common_grammar_trigger_type cVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  int iVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  llama_sampler *plVar9;
  common_sampler *this;
  undefined8 uVar10;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *regex;
  pointer pbVar12;
  pointer pbVar13;
  size_t cap;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  pointer pcVar14;
  pointer pcVar15;
  allocator<char> local_139;
  vector<const_char_*,_std::allocator<const_char_*>_> trigger_patterns_c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  trigger_patterns;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  patterns_anywhere;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  patterns_at_start;
  string local_88;
  string local_68;
  vector<int,_std::allocator<int>_> trigger_tokens;
  
  uVar8 = llama_model_get_vocab();
  llama_sampler_chain_default_params();
  bVar1 = params->no_perf;
  iVar6 = std::__cxx11::string::compare((ulong)&params->grammar,0,(char *)0xb);
  if (iVar6 == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
               ,0xa0,"llguidance (cmake -DLLAMA_LLGUIDANCE=ON) is not enabled");
  }
  patterns_at_start.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  patterns_at_start.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  patterns_at_start.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  patterns_anywhere.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  patterns_anywhere.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  patterns_anywhere.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trigger_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  trigger_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  trigger_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pcVar3 = (params->grammar_triggers).
           super__Vector_base<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pcVar15 = (params->grammar_triggers).
                 super__Vector_base<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>
                 ._M_impl.super__Vector_impl_data._M_start; pcVar15 != pcVar3; pcVar15 = pcVar15 + 1
      ) {
    cVar2 = pcVar15->type;
    if (cVar2 - COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN < 2) {
      this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                &patterns_at_start;
      if (cVar2 != COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN_START) {
        this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  &patterns_anywhere;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,&pcVar15->value);
    }
    else if (cVar2 == COMMON_GRAMMAR_TRIGGER_TYPE_TOKEN) {
      trigger_patterns_c.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(trigger_patterns_c.
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,pcVar15->token);
      std::vector<int,_std::allocator<int>_>::push_back
                (&trigger_tokens,(value_type_conflict1 *)&trigger_patterns_c);
    }
    else {
      if (cVar2 != COMMON_GRAMMAR_TRIGGER_TYPE_WORD) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
                   ,0xbc,"GGML_ASSERT(%s) failed","false && \"unknown trigger type\"");
      }
      regex_escape((string *)&trigger_patterns_c,&pcVar15->value);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &patterns_anywhere,(string *)&trigger_patterns_c);
      std::__cxx11::string::~string((string *)&trigger_patterns_c);
    }
  }
  trigger_patterns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trigger_patterns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  trigger_patterns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (patterns_at_start.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      patterns_at_start.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"|",&local_139);
    string_join(&local_68,&patterns_at_start,&local_88);
    std::operator+(&local_e8,"^(",&local_68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &trigger_patterns_c,&local_e8,")[\\s\\S]*");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &trigger_patterns,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &trigger_patterns_c);
    std::__cxx11::string::~string((string *)&trigger_patterns_c);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  if (patterns_anywhere.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      patterns_anywhere.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"|",&local_139);
    string_join(&local_68,&patterns_anywhere,&local_88);
    std::operator+(&local_e8,"^[\\s\\S]*?(",&local_68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &trigger_patterns_c,&local_e8,")[\\s\\S]*");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &trigger_patterns,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &trigger_patterns_c);
    std::__cxx11::string::~string((string *)&trigger_patterns_c);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  trigger_patterns_c.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  trigger_patterns_c.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  trigger_patterns_c.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&trigger_patterns_c,
             (long)trigger_patterns.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)trigger_patterns.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar13 = trigger_patterns.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar12 = trigger_patterns.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar13;
      pbVar12 = pbVar12 + 1) {
    local_e8._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&trigger_patterns_c,
               (char **)&local_e8);
  }
  pcVar4 = (params->grammar)._M_dataplus._M_p;
  if (params->grammar_lazy == false) {
    plVar9 = (llama_sampler *)llama_sampler_init_grammar(uVar8,pcVar4,"root");
  }
  else {
    plVar9 = (llama_sampler *)
             llama_sampler_init_grammar_lazy_patterns
                       (uVar8,pcVar4,"root",
                        trigger_patterns_c.
                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)trigger_patterns_c.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)trigger_patterns_c.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3,
                        trigger_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)trigger_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)trigger_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2);
  }
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&trigger_patterns_c.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&trigger_patterns);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&trigger_tokens.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&patterns_anywhere);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&patterns_at_start);
  if (plVar9 == (llama_sampler *)0x0) {
    this = (common_sampler *)0x0;
  }
  else {
    this = (common_sampler *)operator_new(0x1a0);
    common_params_sampling::common_params_sampling((common_params_sampling *)this,params);
    this->grmr = plVar9;
    plVar9 = (llama_sampler *)llama_sampler_chain_init(bVar1);
    this->chain = plVar9;
    cap = 0x20;
    if (0x20 < params->n_prev) {
      cap = (size_t)(uint)params->n_prev;
    }
    ring_buffer<int>::ring_buffer(&this->prev,cap);
    (this->cur_p).size = 0;
    (this->cur_p).selected = 0;
    (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->cur_p).data = (llama_token_data *)0x0;
    (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)&(this->cur_p).sorted = 0;
    plVar9 = this->chain;
    uVar7 = llama_vocab_n_tokens(uVar8);
    uVar10 = llama_sampler_init_logit_bias
                       (uVar7,(ulong)((long)(params->logit_bias).
                                            super__Vector_base<llama_logit_bias,_std::allocator<llama_logit_bias>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(params->logit_bias).
                                           super__Vector_base<llama_logit_bias,_std::allocator<llama_logit_bias>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
    llama_sampler_chain_add(plVar9,uVar10);
    iVar6 = params->mirostat;
    if (iVar6 == 2) {
      plVar9 = this->chain;
      uVar8 = llama_sampler_init_temp(params->temp);
      llama_sampler_chain_add(plVar9,uVar8);
      plVar9 = this->chain;
      uVar8 = llama_sampler_init_mirostat_v2(params->mirostat_tau,params->mirostat_eta,params->seed)
      ;
    }
    else if (iVar6 == 1) {
      plVar9 = this->chain;
      uVar10 = llama_sampler_init_temp(params->temp);
      llama_sampler_chain_add(plVar9,uVar10);
      plVar9 = this->chain;
      uVar7 = llama_vocab_n_tokens(uVar8);
      uVar8 = llama_sampler_init_mirostat
                        (params->mirostat_tau,params->mirostat_eta,uVar7,params->seed,100);
    }
    else {
      if (iVar6 != 0) {
        pcVar11 = "false && \"unknown mirostat version\"";
        uVar8 = 0x11f;
LAB_001c9c9e:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
                   ,uVar8,"GGML_ASSERT(%s) failed",pcVar11);
      }
      if (0.0 <= params->top_n_sigma) {
        plVar9 = this->chain;
        uVar8 = llama_sampler_init_top_k(params->top_k);
        llama_sampler_chain_add(plVar9,uVar8);
        plVar9 = this->chain;
        uVar8 = llama_sampler_init_temp(params->temp);
        llama_sampler_chain_add(plVar9,uVar8);
        plVar9 = this->chain;
        uVar8 = llama_sampler_init_top_n_sigma(params->top_n_sigma);
        llama_sampler_chain_add(plVar9,uVar8);
      }
      else {
        pcVar5 = (params->samplers).
                 super__Vector_base<common_sampler_type,_std::allocator<common_sampler_type>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pcVar14 = (params->samplers).
                       super__Vector_base<common_sampler_type,_std::allocator<common_sampler_type>_>
                       ._M_impl.super__Vector_impl_data._M_start; pcVar14 != pcVar5;
            pcVar14 = pcVar14 + 1) {
          switch(*pcVar14) {
          case COMMON_SAMPLER_TYPE_DRY:
            trigger_patterns_c.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            trigger_patterns_c.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            trigger_patterns_c.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
                      (&trigger_patterns_c,
                       (long)(params->dry_sequence_breakers).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(params->dry_sequence_breakers).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5);
            pbVar12 = (params->dry_sequence_breakers).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar13 = (params->dry_sequence_breakers).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar12;
                pbVar13 = pbVar13 + 1) {
              local_e8._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
              std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                        ((vector<char_const*,std::allocator<char_const*>> *)&trigger_patterns_c,
                         (char **)&local_e8);
            }
            plVar9 = this->chain;
            uVar7 = llama_model_n_ctx_train(model);
            uVar10 = llama_sampler_init_dry
                               (params->dry_multiplier,params->dry_base,uVar8,uVar7,
                                params->dry_allowed_length,params->dry_penalty_last_n,
                                trigger_patterns_c.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)trigger_patterns_c.
                                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)trigger_patterns_c.
                                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3);
            llama_sampler_chain_add(plVar9,uVar10);
            std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                      ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)
                       &trigger_patterns_c);
            goto LAB_001c9ab9;
          case COMMON_SAMPLER_TYPE_TOP_K:
            plVar9 = this->chain;
            uVar10 = llama_sampler_init_top_k(params->top_k);
            break;
          case COMMON_SAMPLER_TYPE_TOP_P:
            plVar9 = this->chain;
            uVar10 = llama_sampler_init_top_p(params->top_p,(long)params->min_keep);
            break;
          case COMMON_SAMPLER_TYPE_MIN_P:
            plVar9 = this->chain;
            uVar10 = llama_sampler_init_min_p(params->min_p,(long)params->min_keep);
            break;
          default:
            pcVar11 = "false && \"unknown sampler type\"";
            uVar8 = 0x113;
            goto LAB_001c9c9e;
          case COMMON_SAMPLER_TYPE_TYPICAL_P:
            plVar9 = this->chain;
            uVar10 = llama_sampler_init_typical(params->typ_p,(long)params->min_keep);
            break;
          case COMMON_SAMPLER_TYPE_TEMPERATURE:
            plVar9 = this->chain;
            uVar10 = llama_sampler_init_temp_ext
                               (params->temp,params->dynatemp_range,params->dynatemp_exponent);
            break;
          case COMMON_SAMPLER_TYPE_XTC:
            plVar9 = this->chain;
            uVar10 = llama_sampler_init_xtc
                               (params->xtc_probability,params->xtc_threshold,(long)params->min_keep
                                ,params->seed);
            break;
          case COMMON_SAMPLER_TYPE_INFILL:
            plVar9 = this->chain;
            uVar10 = llama_sampler_init_infill(uVar8);
            break;
          case COMMON_SAMPLER_TYPE_PENALTIES:
            plVar9 = this->chain;
            uVar10 = llama_sampler_init_penalties
                               (params->penalty_repeat,params->penalty_freq,params->penalty_present,
                                params->penalty_last_n);
          }
          llama_sampler_chain_add(plVar9,uVar10);
LAB_001c9ab9:
        }
      }
      plVar9 = this->chain;
      uVar8 = llama_sampler_init_dist(params->seed);
    }
    llama_sampler_chain_add(plVar9,uVar8);
  }
  return this;
}

Assistant:

struct common_sampler * common_sampler_init(const struct llama_model * model, const struct common_params_sampling & params) {
    const llama_vocab * vocab = llama_model_get_vocab(model);

    llama_sampler_chain_params lparams = llama_sampler_chain_default_params();

    lparams.no_perf = params.no_perf;

    struct llama_sampler * grmr;
    if (params.grammar.compare(0, 11, "%llguidance") == 0) {
#ifdef LLAMA_USE_LLGUIDANCE
        grmr = llama_sampler_init_llg(vocab, "lark", params.grammar.c_str());
#else
        GGML_ABORT("llguidance (cmake -DLLAMA_LLGUIDANCE=ON) is not enabled");
#endif // LLAMA_USE_LLGUIDANCE
    } else {
        std::vector<std::string> patterns_at_start;
        std::vector<std::string> patterns_anywhere;
        std::vector<llama_token> trigger_tokens;
        for (const auto & trigger : params.grammar_triggers) {
            switch (trigger.type) {
                case COMMON_GRAMMAR_TRIGGER_TYPE_WORD:
                {
                    const auto & word = trigger.value;
                    patterns_anywhere.push_back(regex_escape(word));
                    break;
                }
                case COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN:
                case COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN_START:
                {
                    const auto & pattern = trigger.value;
                    (trigger.type == COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN_START ? patterns_at_start : patterns_anywhere).push_back(pattern);
                    break;
                }
                case COMMON_GRAMMAR_TRIGGER_TYPE_TOKEN:
                {
                    const auto token = trigger.token;
                    trigger_tokens.push_back(token);
                    break;
                }
                default:
                    GGML_ASSERT(false && "unknown trigger type");
            }
        }

        std::vector<std::string> trigger_patterns;
        if (!patterns_at_start.empty()) {
            trigger_patterns.push_back("^(" + string_join(patterns_at_start, "|") + ")[\\s\\S]*");
        }
        if (!patterns_anywhere.empty()) {
            trigger_patterns.push_back("^[\\s\\S]*?(" + string_join(patterns_anywhere, "|") + ")[\\s\\S]*");
        }

        std::vector<const char *> trigger_patterns_c;
        trigger_patterns_c.reserve(trigger_patterns.size());
        for (const auto & regex : trigger_patterns) {
            trigger_patterns_c.push_back(regex.c_str());
        }

        grmr = params.grammar_lazy
             ? llama_sampler_init_grammar_lazy_patterns(vocab, params.grammar.c_str(), "root",
                                                        trigger_patterns_c.data(), trigger_patterns_c.size(),
                                                        trigger_tokens.data(), trigger_tokens.size())
             :      llama_sampler_init_grammar(vocab, params.grammar.c_str(), "root");
        if (!grmr) {
            return nullptr;
        }
    }

    auto * result = new common_sampler {
        /* .params = */ params,
        /* .grmr   = */ grmr,
        /* .chain  = */ llama_sampler_chain_init(lparams),
        /* .prev   = */ ring_buffer<llama_token>(std::max(32, params.n_prev)),
        /* .cur    = */ {},
        /* .cur_p  = */ {},
    };

    llama_sampler_chain_add(result->chain,
            llama_sampler_init_logit_bias(
                llama_vocab_n_tokens(vocab),
                params.logit_bias.size(),
                params.logit_bias.data()));

    if (params.mirostat == 0) {
        if (params.top_n_sigma >= 0) {
            llama_sampler_chain_add(result->chain, llama_sampler_init_top_k        (params.top_k));
            llama_sampler_chain_add(result->chain, llama_sampler_init_temp         (params.temp));
            llama_sampler_chain_add(result->chain, llama_sampler_init_top_n_sigma  (params.top_n_sigma));
        } else {
            for (const auto & cnstr : params.samplers) {
                switch (cnstr) {
                    case COMMON_SAMPLER_TYPE_DRY:
                        {
                            std::vector<const char *> c_breakers;
                            c_breakers.reserve(params.dry_sequence_breakers.size());
                            for (const auto & str : params.dry_sequence_breakers) {
                                c_breakers.push_back(str.c_str());
                            }

                            llama_sampler_chain_add(result->chain, llama_sampler_init_dry      (vocab, llama_model_n_ctx_train(model), params.dry_multiplier, params.dry_base, params.dry_allowed_length, params.dry_penalty_last_n, c_breakers.data(), c_breakers.size()));
                        }
                        break;
                    case COMMON_SAMPLER_TYPE_TOP_K:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_top_k    (params.top_k));
                        break;
                    case COMMON_SAMPLER_TYPE_TOP_P:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_top_p    (params.top_p, params.min_keep));
                        break;
                    case COMMON_SAMPLER_TYPE_MIN_P:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_min_p    (params.min_p, params.min_keep));
                        break;
                    case COMMON_SAMPLER_TYPE_XTC:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_xtc      (params.xtc_probability, params.xtc_threshold, params.min_keep, params.seed));
                        break;
                    case COMMON_SAMPLER_TYPE_TYPICAL_P:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_typical  (params.typ_p, params.min_keep));
                        break;
                    case COMMON_SAMPLER_TYPE_TEMPERATURE:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_temp_ext (params.temp, params.dynatemp_range, params.dynatemp_exponent));
                        break;
                    case COMMON_SAMPLER_TYPE_INFILL:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_infill   (vocab));
                        break;
                    case COMMON_SAMPLER_TYPE_PENALTIES:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_penalties(params.penalty_last_n, params.penalty_repeat, params.penalty_freq, params.penalty_present));
                        break;
                    default:
                        GGML_ASSERT(false && "unknown sampler type");
                }
            }
        }
        llama_sampler_chain_add(result->chain, llama_sampler_init_dist(params.seed));
    } else if (params.mirostat == 1) {
        llama_sampler_chain_add(result->chain, llama_sampler_init_temp(params.temp));
        llama_sampler_chain_add(result->chain, llama_sampler_init_mirostat(llama_vocab_n_tokens(vocab), params.seed, params.mirostat_tau, params.mirostat_eta, 100));
    } else if (params.mirostat == 2) {
        llama_sampler_chain_add(result->chain, llama_sampler_init_temp(params.temp));
        llama_sampler_chain_add(result->chain, llama_sampler_init_mirostat_v2(params.seed, params.mirostat_tau, params.mirostat_eta));
    } else {
        GGML_ASSERT(false && "unknown mirostat version");
    }

    return result;
}